

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModelHelpers.c
# Opt level: O2

JL_STATUS JlAddStringToDictionaryObject(JlDataObject *DictionaryObject,char *KeyName,char *String)

{
  JL_STATUS JVar1;
  JlDataObject *stringObject;
  
  stringObject = (JlDataObject *)0x0;
  if (KeyName == (char *)0x0 || DictionaryObject == (JlDataObject *)0x0) {
    JVar1 = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    JVar1 = JlCreateStringObject(String,&stringObject);
    if (JVar1 == JL_STATUS_SUCCESS) {
      JVar1 = JlAttachObjectToDictionaryObject(DictionaryObject,KeyName,stringObject);
      if (JVar1 == JL_STATUS_SUCCESS) {
        JVar1 = JL_STATUS_SUCCESS;
      }
      else {
        JlFreeObjectTree(&stringObject);
      }
    }
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlAddStringToDictionaryObject
    (
        JlDataObject*       DictionaryObject,   // [in,out]
        char const*         KeyName,            // [in]
        char const*         String              // [in]
    )
{
    JL_STATUS jlStatus;
    JlDataObject* stringObject = NULL;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName )
    {
        jlStatus = JlCreateStringObject( String, &stringObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlAttachObjectToDictionaryObject( DictionaryObject, KeyName, stringObject );
            if( JL_STATUS_SUCCESS != jlStatus )
            {
                (void) JlFreeObjectTree( &stringObject );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}